

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SliceBase.h
# Opt level: O0

double __thiscall
arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
getNumber<double>(SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *this)

{
  bool bVar1;
  int64_t iVar2;
  uint64_t uVar3;
  char *msg;
  Exception *in_RDI;
  undefined1 auVar4 [16];
  SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *in_stack_00000008;
  Exception *this_00;
  double local_8;
  
  this_00 = in_RDI;
  bVar1 = isDouble((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)0x125de8);
  if (bVar1) {
    local_8 = getDouble((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                        this_00);
  }
  else {
    bVar1 = isInt((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)0x125e0d);
    if ((!bVar1) &&
       (bVar1 = isSmallInt((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                           0x125e1b), !bVar1)) {
      bVar1 = isUInt((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)0x125e45
                    );
      if (bVar1) {
        uVar3 = getUIntUnchecked((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>
                                  *)in_RDI);
        auVar4._8_4_ = (int)(uVar3 >> 0x20);
        auVar4._0_8_ = uVar3;
        auVar4._12_4_ = 0x45300000;
        return (auVar4._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0);
      }
      msg = (char *)__cxa_allocate_exception(0x18);
      Exception::Exception(this_00,(ExceptionType)((ulong)in_RDI >> 0x20),msg);
      __cxa_throw(msg,&Exception::typeinfo,Exception::~Exception);
    }
    iVar2 = getIntUnchecked(in_stack_00000008);
    local_8 = (double)iVar2;
  }
  return local_8;
}

Assistant:

T getNumber() const {
    if constexpr (std::is_integral_v<T>) {
      if constexpr (std::is_signed_v<T>) {
        // signed integral type
        if (isDouble()) {
          auto v = getDouble();
          // 9223372036854774784.0 then 9223372036854775808.0
          // (2^63 not represented in int64_t)
          constexpr auto kMax =
              sizeof(T) > 4
                  ? 9223372036854774784.0
                  : static_cast<double>((std::numeric_limits<T>::max)());
          if (v < static_cast<double>((std::numeric_limits<T>::min)()) ||
              kMax < v) {
            throw Exception(Exception::NumberOutOfRange);
          }
          return static_cast<T>(v);
        }

        int64_t v = getInt();
        if (v < static_cast<int64_t>((std::numeric_limits<T>::min)()) ||
            v > static_cast<int64_t>((std::numeric_limits<T>::max)())) {
          throw Exception(Exception::NumberOutOfRange);
        }
        return static_cast<T>(v);
      } else {
        // unsigned integral type
        if (isDouble()) {
          auto v = getDouble();
          // 18446744073709549568.0 then 18446744073709551616.0
          // (2^64 not represented in uint64_t)
          constexpr auto kMax =
              sizeof(T) > 4
                  ? 18446744073709549568.0
                  : static_cast<double>((std::numeric_limits<T>::max)());
          if (v < 0.0 || kMax < v) {
            throw Exception(Exception::NumberOutOfRange);
          }
          return static_cast<T>(v);
        }

        // may fail if number is < 0!
        uint64_t v = getUInt();
        if (v > static_cast<uint64_t>((std::numeric_limits<T>::max)())) {
          throw Exception(Exception::NumberOutOfRange);
        }
        return static_cast<T>(v);
      }
    } else {
      // floating point type

      if (isDouble()) {
        return static_cast<T>(getDouble());
      }
      if (isInt() || isSmallInt()) {
        return static_cast<T>(getIntUnchecked());
      }
      if (isUInt()) {
        return static_cast<T>(getUIntUnchecked());
      }

      throw Exception(Exception::InvalidValueType, "Expecting numeric type");
    }
  }